

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DropFaceNormalsProcess.cpp
# Opt level: O0

bool __thiscall
Assimp::DropFaceNormalsProcess::DropMeshFaceNormals(DropFaceNormalsProcess *this,aiMesh *pMesh)

{
  aiMesh *pMesh_local;
  DropFaceNormalsProcess *this_local;
  
  if (pMesh->mNormals == (aiVector3D *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (pMesh->mNormals != (aiVector3D *)0x0) {
      operator_delete__(pMesh->mNormals);
    }
    pMesh->mNormals = (aiVector3D *)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DropFaceNormalsProcess::DropMeshFaceNormals (aiMesh* pMesh) {
    if (NULL == pMesh->mNormals) {
        return false;
    }
    
    delete[] pMesh->mNormals;
    pMesh->mNormals = nullptr;
    return true;
}